

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O2

Code * __thiscall md::Code::bset(Code *this,DataRegister *dx,Param *target)

{
  uint16_t uVar1;
  int iVar2;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  iVar2 = (**(dx->super_Register).super_Param._vptr_Param)(dx);
  uVar1 = Param::getMXn(target);
  add_word(this,uVar1 + (short)(iVar2 << 9) + 0x1c0);
  (*target->_vptr_Param[2])(&local_30,target);
  add_bytes(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  return this;
}

Assistant:

Code& Code::bset(const DataRegister& dx, const Param& target)
{
    uint16_t opcode = 0x01C0 + (dx.getXn() << 9) + target.getMXn();
    this->add_opcode(opcode);
    this->add_bytes(target.getAdditionnalData());
    return *this;
}